

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O1

void __thiscall
anon_unknown.dwarf_a40a3a::TransformSelectorAt::~TransformSelectorAt(TransformSelectorAt *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer plVar2;
  pointer pcVar3;
  
  (this->super_TransformSelectorIndexes).super_TransformSelector.super_TransformSelector.
  _vptr_TransformSelector = (_func_int **)&PTR__TransformSelectorIndexes_00b34cc0;
  plVar2 = (this->super_TransformSelectorIndexes).Indexes.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  if (plVar2 != (pointer)0x0) {
    operator_delete(plVar2,(long)(this->super_TransformSelectorIndexes).Indexes.
                                 super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)plVar2);
  }
  (this->super_TransformSelectorIndexes).super_TransformSelector.super_TransformSelector.
  _vptr_TransformSelector = (_func_int **)&PTR__TransformSelector_00b34c00;
  pcVar3 = (this->super_TransformSelectorIndexes).super_TransformSelector.Tag._M_dataplus._M_p;
  paVar1 = &(this->super_TransformSelectorIndexes).super_TransformSelector.Tag.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x40);
  return;
}

Assistant:

TransformSelectorAt(std::vector<index_type> const& indexes)
    : TransformSelectorIndexes("AT", indexes)
  {
  }